

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

int coda_is_identifier(char *name)

{
  ushort **ppuVar1;
  int local_1c;
  int i;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = 0;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*name] & 0x400) == 0) {
      name_local._4_4_ = 0;
    }
    else {
      for (local_1c = 1; name[local_1c] != '\0'; local_1c = local_1c + 1) {
        ppuVar1 = __ctype_b_loc();
        if ((((*ppuVar1)[(int)name[local_1c]] & 8) == 0) && (name[local_1c] != '_')) {
          return 0;
        }
      }
      name_local._4_4_ = 1;
    }
  }
  return name_local._4_4_;
}

Assistant:

int coda_is_identifier(const char *name)
{
    int i;

    if (name == NULL)
    {
        return 0;
    }
    if (!isalpha(*name))
    {
        return 0;
    }
    i = 1;
    while (name[i] != '\0')
    {
        if (!(isalnum(name[i]) || name[i] == '_'))
        {
            return 0;
        }
        i++;
    }
    return 1;
}